

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  
  sVar2 = 0xffffffffffffffff;
  if (pos < this->size_) {
    pcVar1 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::not_in_view>>
                       (this->data_ + pos,this->data_ + this->size_,v.data_,v.size_);
    sVar2 = 0xffffffffffffffff;
    if (this->data_ + this->size_ != pcVar1) {
      sVar2 = (long)pcVar1 - (long)this->data_;
    }
  }
  return sVar2;
}

Assistant:

nssv_constexpr size_type find_first_not_of( basic_string_view v, size_type pos = 0 ) const nssv_noexcept  // (1)
    {
        return pos >= size()
            ? npos
            : to_pos( std::find_if( cbegin() + pos, cend(), not_in_view( v ) ) );
    }